

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O2

bool __thiscall S1Interval::ApproxEquals(S1Interval *this,S1Interval *y,double max_error)

{
  double dVar1;
  double dVar2;
  S1Interval *pSVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = (this->bounds_).c_[0];
  dVar6 = (this->bounds_).c_[1];
  if ((((dVar5 != 3.141592653589793) || (NAN(dVar5))) || (dVar6 != -3.141592653589793)) ||
     (pSVar3 = y, NAN(dVar6))) {
    dVar1 = (y->bounds_).c_[0];
    dVar2 = (y->bounds_).c_[1];
    if (((dVar1 != 3.141592653589793) || (NAN(dVar1))) ||
       ((dVar2 != -3.141592653589793 || (pSVar3 = this, NAN(dVar2))))) {
      if ((((dVar5 == -3.141592653589793) && (!NAN(dVar5))) &&
          ((dVar6 == 3.141592653589793 && (pSVar3 = y, !NAN(dVar6))))) ||
         ((((dVar1 == -3.141592653589793 && (!NAN(dVar1))) && (dVar2 == 3.141592653589793)) &&
          (pSVar3 = this, !NAN(dVar2))))) {
        dVar5 = GetLength(pSVar3);
        dVar6 = (3.141592653589793 - max_error) + (3.141592653589793 - max_error);
      }
      else {
        dVar5 = remainder(dVar1 - dVar5,6.283185307179586);
        if ((max_error < ABS(dVar5)) ||
           (dVar5 = remainder((y->bounds_).c_[1] - (this->bounds_).c_[1],6.283185307179586),
           max_error < ABS(dVar5))) {
          return false;
        }
        dVar5 = GetLength(this);
        dVar6 = GetLength(y);
        dVar6 = ABS(dVar5 - dVar6);
        dVar5 = max_error + max_error;
      }
      bVar4 = dVar5 < dVar6;
      goto LAB_001e5671;
    }
  }
  dVar5 = GetLength(pSVar3);
  bVar4 = max_error + max_error < dVar5;
LAB_001e5671:
  return !bVar4;
}

Assistant:

bool S1Interval::ApproxEquals(const S1Interval& y, double max_error) const {
  // Full and empty intervals require special cases because the "endpoints"
  // are considered to be positioned arbitrarily.
  if (is_empty()) return y.GetLength() <= 2 * max_error;
  if (y.is_empty()) return GetLength() <= 2 * max_error;
  if (is_full()) return y.GetLength() >= 2 * (M_PI - max_error);
  if (y.is_full()) return GetLength() >= 2 * (M_PI - max_error);

  // The purpose of the last test below is to verify that moving the endpoints
  // does not invert the interval, e.g. [-1e20, 1e20] vs. [1e20, -1e20].
  return (fabs(remainder(y.lo() - lo(), 2 * M_PI)) <= max_error &&
          fabs(remainder(y.hi() - hi(), 2 * M_PI)) <= max_error &&
          fabs(GetLength() - y.GetLength()) <= 2 * max_error);
}